

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::ModelDescription::Clear(ModelDescription *this)

{
  string *psVar1;
  Arena *pAVar2;
  ModelDescription *this_local;
  
  google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Clear
            (&this->input_);
  google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Clear
            (&this->output_);
  google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Clear
            (&this->traininginput_);
  psVar1 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::ClearToEmptyNoArena
            (&this->predictedfeaturename_,psVar1);
  psVar1 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::ClearToEmptyNoArena
            (&this->predictedprobabilitiesname_,psVar1);
  pAVar2 = GetArenaNoVirtual(this);
  if (((pAVar2 == (Arena *)0x0) && (this->metadata_ != (Metadata *)0x0)) &&
     (this->metadata_ != (Metadata *)0x0)) {
    (*(this->metadata_->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->metadata_ = (Metadata *)0x0;
  return;
}

Assistant:

void ModelDescription::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.ModelDescription)
  input_.Clear();
  output_.Clear();
  traininginput_.Clear();
  predictedfeaturename_.ClearToEmptyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  predictedprobabilitiesname_.ClearToEmptyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (GetArenaNoVirtual() == NULL && metadata_ != NULL) {
    delete metadata_;
  }
  metadata_ = NULL;
}